

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
          (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *this,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *other)

{
  byte *start;
  byte bVar1;
  int iVar2;
  ValueLength __n;
  ulong uVar3;
  
  start = *(byte **)this;
  if (start == *(byte **)other) {
    return true;
  }
  if (*start != **(byte **)other) {
    return false;
  }
  bVar1 = "\x01\x01"[*start];
  __n = (ValueLength)bVar1;
  if (__n == 0) {
    __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     start);
    bVar1 = "\x01\x01"[**(byte **)other];
    if (bVar1 == 0) {
      uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        (other,*(byte **)other);
      goto LAB_0010a038;
    }
  }
  uVar3 = (ulong)bVar1;
LAB_0010a038:
  if (__n != uVar3) {
    return false;
  }
  iVar2 = bcmp(*(void **)this,*(void **)other,__n);
  return iVar2 == 0;
}

Assistant:

bool binaryEquals(SliceBase<S, T> const& other) const {
    if (start() == other.start()) {
      // same underlying data, so the slices must be identical
      return true;
    }

    if (head() != other.head()) {
      return false;
    }

    ValueLength const size = byteSize();

    if (size != other.byteSize()) {
      return false;
    }

    return (std::memcmp(start(), other.start(), checkOverflow(size)) == 0);
  }